

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::update_derived_pipeline<VkGraphicsPipelineCreateInfo>
               (VkGraphicsPipelineCreateInfo *info,VkPipeline *base_pipelines,
               uint32_t base_pipeline_count)

{
  bool bVar1;
  LogLevel LVar2;
  uint32_t base_pipeline_count_local;
  VkPipeline *base_pipelines_local;
  VkGraphicsPipelineCreateInfo *info_local;
  
  if ((info->flags & 4) == 0) {
    info->basePipelineHandle = (VkPipeline)0x0;
    info->basePipelineIndex = -1;
  }
  else {
    if ((info->basePipelineHandle == (VkPipeline)0x0) && (-1 < info->basePipelineIndex)) {
      if (base_pipeline_count <= (uint)info->basePipelineIndex) {
        LVar2 = get_thread_log_level();
        if (((int)LVar2 < 3) &&
           (bVar1 = Internal::log_thread_callback
                              (LOG_ERROR,"Base pipeline index is out of range.\n"), !bVar1)) {
          fprintf(_stderr,"Fossilize ERROR: Base pipeline index is out of range.\n");
        }
        return false;
      }
      info->basePipelineHandle = base_pipelines[info->basePipelineIndex];
    }
    info->basePipelineIndex = -1;
  }
  return true;
}

Assistant:

static bool update_derived_pipeline(CreateInfo *info, const VkPipeline *base_pipelines, uint32_t base_pipeline_count)
{
	// Check for case where application made use of derivative pipelines and relied on the indexing behavior
	// into an array of pCreateInfos. In the replayer, we only do it one by one,
	// so we need to pass the correct handle to the create pipeline calls.
	if ((info->flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0)
	{
		if (info->basePipelineHandle == VK_NULL_HANDLE && info->basePipelineIndex >= 0)
		{
			if (uint32_t(info->basePipelineIndex) >= base_pipeline_count)
			{
				LOGE_LEVEL("Base pipeline index is out of range.\n");
				return false;
			}

			info->basePipelineHandle = base_pipelines[info->basePipelineIndex];
		}
		info->basePipelineIndex = -1;
	}
	else
	{
		// Explicitly ignore parameter.
		info->basePipelineHandle = VK_NULL_HANDLE;
		info->basePipelineIndex = -1;
	}

	return true;
}